

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void free_master(CManager_conflict cm,void *vmaster)

{
  void *in_RSI;
  int i;
  EVmaster master;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < *(int *)((long)in_RSI + 0x34); local_1c = local_1c + 1) {
    if (*(long *)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38) != 0) {
      free(*(void **)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38));
    }
    if (*(long *)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38 + 8) != 0) {
      free(*(void **)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38 + 8));
    }
    if (*(long *)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38 + 0x10) != 0) {
      free_attr_list(*(undefined8 *)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38 + 0x10))
      ;
    }
    if (*(long *)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38 + 0x18) != 0) {
      free(*(void **)(*(long *)((long)in_RSI + 0x38) + (long)local_1c * 0x38 + 0x18));
    }
  }
  free(*(void **)((long)in_RSI + 0x38));
  if (*(long *)((long)in_RSI + 0x48) != 0) {
    free(*(void **)((long)in_RSI + 0x48));
  }
  free(in_RSI);
  return;
}

Assistant:

static void
free_master(CManager cm, void *vmaster)
{
    EVmaster master = (EVmaster)vmaster;
    int i;
    for (i=0; i < master->node_count; i++) {
	if (master->nodes[i].name) free(master->nodes[i].name);
	if (master->nodes[i].canonical_name) 
	    free(master->nodes[i].canonical_name);
	if (master->nodes[i].contact_list) 
	    free_attr_list(master->nodes[i].contact_list);
	if (master->nodes[i].str_contact_list) 
	    free(master->nodes[i].str_contact_list);
    }
    free(master->nodes);
    if (master->my_contact_str) free(master->my_contact_str);
    free(master);
}